

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O0

Promise<kj::HttpServer::Connection::LoopResult> __thiscall
kj::HttpServer::Connection::onHeaders
          (Connection *this,RequestConnectOrProtocolError *requestOrProtocolError)

{
  long *plVar1;
  char *pcVar2;
  size_t sVar3;
  char *pcVar4;
  char *pcVar5;
  uint uVar6;
  undefined4 uVar7;
  bool bVar8;
  byte extraout_AL;
  byte extraout_AL_00;
  byte extraout_AL_01;
  byte extraout_AL_02;
  byte extraout_AL_03;
  byte extraout_AL_04;
  Tag TVar9;
  LoopResult LVar10;
  undefined8 *puVar11;
  Coroutine<kj::HttpServer::Connection::LoopResult> *this_00;
  Promise<void> *pPVar12;
  OneOf<kj::HttpHeaders::Request,_kj::HttpHeaders::ConnectRequest,_kj::HttpHeaders::ProtocolError>
  *pOVar13;
  ConnectRequest *pCVar14;
  Request *pRVar15;
  ProtocolError *pPVar16;
  Promise<void> *promise;
  Promise<kj::HttpServer::Connection::LoopResult> *pPVar17;
  PromiseAwaiter<void> *__return_storage_ptr__;
  HttpOutputStream *this_01;
  PromiseAwaiter<void> *__return_storage_ptr___00;
  HttpOutputStream *this_02;
  undefined8 *puVar18;
  PromiseAwaiter<kj::HttpServer::Connection::LoopResult> *__return_storage_ptr___01;
  Connection *this_03;
  PromiseAwaiter<kj::HttpServer::Connection::LoopResult> *__return_storage_ptr___02;
  Connection *this_04;
  long *plVar19;
  Own<kj::(anonymous_namespace)::HttpDiscardingEntityWriter,_std::nullptr_t> *t;
  Promise<void> *t_00;
  PromiseAwaiter<void> *__return_storage_ptr___03;
  Promise<void> *this_05;
  PromiseAwaiter<kj::HttpServer::Connection::LoopResult> *__return_storage_ptr___04;
  Connection *this_06;
  ProtocolError *pPVar20;
  undefined8 in_RDX;
  void *pvVar21;
  void *in_stack_ffffffffffffef10;
  int local_1040;
  int local_1008;
  int local_ff0;
  int local_fc8;
  bool local_f96;
  HttpMethod local_c24;
  OneOf<kj::HttpMethod,_kj::HttpConnectMethod> local_c20 [31];
  undefined8 local_a30;
  anon_class_16_2_f7b14595 local_9f8;
  undefined1 local_9e8 [2504];
  UnknownType local_20 [8];
  RequestConnectOrProtocolError *requestOrProtocolError_local;
  Connection *this_local;
  
  local_20 = (UnknownType  [8])in_RDX;
  requestOrProtocolError_local = requestOrProtocolError;
  this_local = this;
  puVar11 = (undefined8 *)operator_new(0xdb0);
  *puVar11 = onHeaders;
  puVar11[1] = onHeaders;
  __return_storage_ptr__ = (PromiseAwaiter<void> *)(puVar11 + 0x47);
  this_01 = (HttpOutputStream *)(puVar11 + 0x1a5);
  __return_storage_ptr___00 = (PromiseAwaiter<void> *)(puVar11 + 0x7e);
  this_02 = (HttpOutputStream *)(puVar11 + 0x1a6);
  puVar18 = puVar11 + 0x1a7;
  __return_storage_ptr___01 =
       (PromiseAwaiter<kj::HttpServer::Connection::LoopResult> *)(puVar11 + 0xb5);
  this_03 = (Connection *)(puVar11 + 0x1aa);
  __return_storage_ptr___02 =
       (PromiseAwaiter<kj::HttpServer::Connection::LoopResult> *)(puVar11 + 0xec);
  this_04 = (Connection *)(puVar11 + 0x1ad);
  plVar19 = puVar11 + 0x1ae;
  t = (Own<kj::(anonymous_namespace)::HttpDiscardingEntityWriter,_std::nullptr_t> *)
      (puVar11 + 0x1a1);
  pPVar12 = (Promise<void> *)(puVar11 + 0x1b0);
  t_00 = (Promise<void> *)(puVar11 + 0x1b1);
  __return_storage_ptr___03 = (PromiseAwaiter<void> *)(puVar11 + 0x123);
  this_05 = (Promise<void> *)(puVar11 + 0x1b2);
  __return_storage_ptr___04 =
       (PromiseAwaiter<kj::HttpServer::Connection::LoopResult> *)(puVar11 + 0x15a);
  this_06 = (Connection *)(puVar11 + 0x1b3);
  pPVar20 = (ProtocolError *)(puVar11 + 0x191);
  this_00 = (Coroutine<kj::HttpServer::Connection::LoopResult> *)(puVar11 + 2);
  puVar11[0x1b4] = requestOrProtocolError;
  puVar11[0x1a3] = local_20;
  SourceLocation::SourceLocation
            ((SourceLocation *)(puVar11 + 0x198),
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
             ,"onHeaders",0x1dae,0x1b);
  pvVar21 = (void *)puVar11[0x19a];
  kj::_::Coroutine<kj::HttpServer::Connection::LoopResult>::Coroutine
            (this_00,*(SourceLocation *)(puVar11 + 0x198));
  kj::_::Coroutine<kj::HttpServer::Connection::LoopResult>::get_return_object
            ((Coroutine<kj::HttpServer::Connection::LoopResult> *)this);
  kj::_::CoroutineBase::initial_suspend((CoroutineBase *)this_00);
  bVar8 = std::__n4861::suspend_never::await_ready((suspend_never *)((long)puVar11 + 0xdad));
  if (!bVar8) {
    *(undefined1 *)((long)puVar11 + 0xdac) = 0;
    onHeaders(in_stack_ffffffffffffef10,pvVar21);
    return (PromiseBase)(PromiseBase)this;
  }
  std::__n4861::suspend_never::await_resume((suspend_never *)((long)puVar11 + 0xdad));
  if ((*(byte *)(puVar11[0x1b4] + 0x160) & 1) == 0) {
    if ((*(byte *)(puVar11[0x1b4] + 0x161) & 1) == 0) {
      pOVar13 = OneOf<kj::HttpHeaders::Request,_kj::HttpHeaders::ConnectRequest,_kj::HttpHeaders::ProtocolError>
                ::_switchSubject((OneOf<kj::HttpHeaders::Request,_kj::HttpHeaders::ConnectRequest,_kj::HttpHeaders::ProtocolError>
                                  *)puVar11[0x1a3]);
      *puVar18 = pOVar13;
      TVar9 = OneOf<kj::HttpHeaders::Request,_kj::HttpHeaders::ConnectRequest,_kj::HttpHeaders::ProtocolError>
              ::which((OneOf<kj::HttpHeaders::Request,_kj::HttpHeaders::ConnectRequest,_kj::HttpHeaders::ProtocolError>
                       *)*puVar18);
      if (TVar9 == _variant0) {
        pRVar15 = OneOf<kj::HttpHeaders::Request,_kj::HttpHeaders::ConnectRequest,_kj::HttpHeaders::ProtocolError>
                  ::get<kj::HttpHeaders::Request>
                            ((OneOf<kj::HttpHeaders::Request,_kj::HttpHeaders::ConnectRequest,_kj::HttpHeaders::ProtocolError>
                              *)*puVar18);
        puVar11[0x1ab] = pRVar15;
        puVar11[0x1ac] = puVar11[0x1ab];
        if (puVar11[0x1ac] == 0) {
          local_1008 = 8;
        }
        else {
          onRequest(this_04,(Request *)puVar11[0x1b4]);
          pPVar17 = kj::_::Coroutine<kj::HttpServer::Connection::LoopResult>::
                    await_transform<kj::Promise<kj::HttpServer::Connection::LoopResult>>
                              (this_00,(Promise<kj::HttpServer::Connection::LoopResult> *)this_04);
          co_await<kj::HttpServer::Connection::LoopResult>(__return_storage_ptr___02,pPVar17);
          bVar8 = kj::_::PromiseAwaiterBase::await_ready
                            ((PromiseAwaiterBase *)__return_storage_ptr___02);
          if (!bVar8) {
            *(undefined1 *)((long)puVar11 + 0xdac) = 4;
            onHeaders(in_stack_ffffffffffffef10,pvVar21);
            if ((extraout_AL_02 & 1) != 0) {
              return (PromiseBase)(PromiseBase)this;
            }
          }
          LVar10 = kj::_::PromiseAwaiter<kj::HttpServer::Connection::LoopResult>::await_resume
                             (__return_storage_ptr___02);
          kj::_::
          CoroutineMixin<kj::_::Coroutine<kj::HttpServer::Connection::LoopResult>,_kj::HttpServer::Connection::LoopResult>
          ::return_value((CoroutineMixin<kj::_::Coroutine<kj::HttpServer::Connection::LoopResult>,_kj::HttpServer::Connection::LoopResult>
                          *)this_00,LVar10);
          kj::_::PromiseAwaiter<kj::HttpServer::Connection::LoopResult>::~PromiseAwaiter
                    (__return_storage_ptr___02);
          Promise<kj::HttpServer::Connection::LoopResult>::~Promise
                    ((Promise<kj::HttpServer::Connection::LoopResult> *)this_04);
          local_1008 = 3;
        }
        if (local_1008 == 8) {
          local_ff0 = 4;
        }
        else {
          local_ff0 = local_1008;
        }
      }
      else if (TVar9 == _variant1) {
        pCVar14 = OneOf<kj::HttpHeaders::Request,_kj::HttpHeaders::ConnectRequest,_kj::HttpHeaders::ProtocolError>
                  ::get<kj::HttpHeaders::ConnectRequest>
                            ((OneOf<kj::HttpHeaders::Request,_kj::HttpHeaders::ConnectRequest,_kj::HttpHeaders::ProtocolError>
                              *)*puVar18);
        puVar11[0x1a8] = pCVar14;
        puVar11[0x1a9] = puVar11[0x1a8];
        if (puVar11[0x1a9] == 0) {
          local_fc8 = 5;
        }
        else {
          onConnect(this_03,(ConnectRequest *)puVar11[0x1b4]);
          pPVar17 = kj::_::Coroutine<kj::HttpServer::Connection::LoopResult>::
                    await_transform<kj::Promise<kj::HttpServer::Connection::LoopResult>>
                              (this_00,(Promise<kj::HttpServer::Connection::LoopResult> *)this_03);
          co_await<kj::HttpServer::Connection::LoopResult>(__return_storage_ptr___01,pPVar17);
          bVar8 = kj::_::PromiseAwaiterBase::await_ready
                            ((PromiseAwaiterBase *)__return_storage_ptr___01);
          if (!bVar8) {
            *(undefined1 *)((long)puVar11 + 0xdac) = 3;
            onHeaders(in_stack_ffffffffffffef10,pvVar21);
            if ((extraout_AL_01 & 1) != 0) {
              return (PromiseBase)(PromiseBase)this;
            }
          }
          LVar10 = kj::_::PromiseAwaiter<kj::HttpServer::Connection::LoopResult>::await_resume
                             (__return_storage_ptr___01);
          kj::_::
          CoroutineMixin<kj::_::Coroutine<kj::HttpServer::Connection::LoopResult>,_kj::HttpServer::Connection::LoopResult>
          ::return_value((CoroutineMixin<kj::_::Coroutine<kj::HttpServer::Connection::LoopResult>,_kj::HttpServer::Connection::LoopResult>
                          *)this_00,LVar10);
          kj::_::PromiseAwaiter<kj::HttpServer::Connection::LoopResult>::~PromiseAwaiter
                    (__return_storage_ptr___01);
          Promise<kj::HttpServer::Connection::LoopResult>::~Promise
                    ((Promise<kj::HttpServer::Connection::LoopResult> *)this_03);
          local_fc8 = 3;
        }
        if (local_fc8 == 5) {
          local_ff0 = 4;
        }
        else {
          local_ff0 = local_fc8;
        }
      }
      else {
        if (TVar9 == _variant2) {
          pPVar16 = OneOf<kj::HttpHeaders::Request,_kj::HttpHeaders::ConnectRequest,_kj::HttpHeaders::ProtocolError>
                    ::get<kj::HttpHeaders::ProtocolError>
                              ((OneOf<kj::HttpHeaders::Request,_kj::HttpHeaders::ConnectRequest,_kj::HttpHeaders::ProtocolError>
                                *)*puVar18);
          *plVar19 = (long)pPVar16;
          puVar11[0x1af] = *plVar19;
          if (puVar11[0x1af] == 0) {
            local_1040 = 0xb;
          }
          else {
            *(byte *)((long)puVar11 + 0xdae) = *(int *)*plVar19 == 0x1af;
            if ((*(byte *)((long)puVar11 + 0xdae) & 1) != 0) {
              heap<kj::(anonymous_namespace)::HttpDiscardingEntityWriter>();
              local_9f8.this = (Connection *)puVar11[0x1b4];
              local_9f8.dummy = t;
              evalNow<kj::HttpServer::Connection::onHeaders(kj::OneOf<kj::HttpHeaders::Request,kj::HttpHeaders::ConnectRequest,kj::HttpHeaders::ProtocolError>&&)::_lambda()_1_>
                        ((kj *)local_9e8,&local_9f8);
              SourceLocation::SourceLocation
                        ((SourceLocation *)(puVar11 + 0x19b),
                         "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
                         ,"onHeaders",0x1dd9,0x1e);
              Promise<void>::
              catch_<kj::HttpServer::Connection::onHeaders(kj::OneOf<kj::HttpHeaders::Request,kj::HttpHeaders::ConnectRequest,kj::HttpHeaders::ProtocolError>&&)::_lambda(kj::Exception&&)_1_>
                        ((Promise<void> *)(local_9e8 + 8),(Type *)local_9e8,
                         *(SourceLocation *)(puVar11 + 0x19b));
              mv<kj::Own<kj::(anonymous_namespace)::HttpDiscardingEntityWriter,decltype(nullptr)>>
                        (t);
              Promise<void>::
              attach<kj::Own<kj::(anonymous_namespace)::HttpDiscardingEntityWriter,decltype(nullptr)>>
                        (pPVar12,(Own<kj::(anonymous_namespace)::HttpDiscardingEntityWriter,_std::nullptr_t>
                                  *)(local_9e8 + 8));
              Promise<void>::~Promise((Promise<void> *)(local_9e8 + 8));
              Promise<void>::~Promise((Promise<void> *)local_9e8);
              plVar1 = *(long **)(*(long *)(puVar11[0x1b4] + 0x18) + 8);
              local_a30 = *(undefined8 *)(*(long *)(puVar11[0x1b4] + 0x18) + 0x40);
              (**(code **)(*plVar1 + 0x10))(t_00,plVar1,local_a30);
              mv<kj::Promise<void>>(t_00);
              SourceLocation::SourceLocation
                        ((SourceLocation *)(puVar11 + 0x19e),
                         "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
                         ,"onHeaders",0x1dde,0x14);
              pvVar21 = (void *)puVar11[0x1a0];
              Promise<void>::exclusiveJoin(this_05,pPVar12,*(SourceLocation *)(puVar11 + 0x19e));
              promise = kj::_::Coroutine<kj::HttpServer::Connection::LoopResult>::
                        await_transform<kj::Promise<void>>(this_00,this_05);
              co_await<void>(__return_storage_ptr___03,promise);
              bVar8 = kj::_::PromiseAwaiterBase::await_ready
                                ((PromiseAwaiterBase *)__return_storage_ptr___03);
              if (!bVar8) {
                *(undefined1 *)((long)puVar11 + 0xdac) = 5;
                onHeaders(in_stack_ffffffffffffef10,pvVar21);
                if ((extraout_AL_03 & 1) != 0) {
                  return (PromiseBase)(PromiseBase)this;
                }
              }
              kj::_::PromiseAwaiter<void>::await_resume(__return_storage_ptr___03);
              kj::_::PromiseAwaiter<void>::~PromiseAwaiter(__return_storage_ptr___03);
              Promise<void>::~Promise(this_05);
              Promise<void>::~Promise(t_00);
              Promise<void>::~Promise(pPVar12);
              Own<kj::(anonymous_namespace)::HttpDiscardingEntityWriter,_std::nullptr_t>::~Own(t);
            }
            local_c24 = GET;
            OneOf<kj::HttpMethod,kj::HttpConnectMethod>::OneOf<kj::HttpMethod,int>
                      ((OneOf<kj::HttpMethod,kj::HttpConnectMethod> *)local_c20,&local_c24);
            Maybe<kj::OneOf<kj::HttpMethod,_kj::HttpConnectMethod>_>::operator=
                      ((Maybe<kj::OneOf<kj::HttpMethod,_kj::HttpConnectMethod>_> *)
                       (puVar11[0x1b4] + 0x148),local_c20);
            OneOf<kj::HttpMethod,_kj::HttpConnectMethod>::~OneOf(local_c20);
            pPVar16 = mv<kj::HttpHeaders::ProtocolError>((ProtocolError *)*plVar19);
            puVar11[0x197] = (pPVar16->rawContent).size_;
            uVar6 = pPVar16->statusCode;
            uVar7 = *(undefined4 *)&pPVar16->field_0x4;
            pcVar2 = (pPVar16->statusMessage).content.ptr;
            sVar3 = (pPVar16->statusMessage).content.size_;
            pcVar4 = (pPVar16->description).content.ptr;
            pcVar5 = (pPVar16->rawContent).ptr;
            puVar11[0x195] = (pPVar16->description).content.size_;
            puVar11[0x196] = pcVar5;
            puVar11[0x193] = sVar3;
            puVar11[0x194] = pcVar4;
            pPVar20->statusCode = uVar6;
            *(undefined4 *)&pPVar20->field_0x4 = uVar7;
            puVar11[0x192] = pcVar2;
            pvVar21 = (void *)puVar11[0x193];
            in_stack_ffffffffffffef10 = (void *)puVar11[0x194];
            sendError(this_06,*pPVar20);
            pPVar17 = kj::_::Coroutine<kj::HttpServer::Connection::LoopResult>::
                      await_transform<kj::Promise<kj::HttpServer::Connection::LoopResult>>
                                (this_00,(Promise<kj::HttpServer::Connection::LoopResult> *)this_06)
            ;
            co_await<kj::HttpServer::Connection::LoopResult>(__return_storage_ptr___04,pPVar17);
            bVar8 = kj::_::PromiseAwaiterBase::await_ready
                              ((PromiseAwaiterBase *)__return_storage_ptr___04);
            if (!bVar8) {
              *(undefined1 *)((long)puVar11 + 0xdac) = 6;
              onHeaders(in_stack_ffffffffffffef10,pvVar21);
              if ((extraout_AL_04 & 1) != 0) {
                return (PromiseBase)(PromiseBase)this;
              }
            }
            LVar10 = kj::_::PromiseAwaiter<kj::HttpServer::Connection::LoopResult>::await_resume
                               (__return_storage_ptr___04);
            kj::_::
            CoroutineMixin<kj::_::Coroutine<kj::HttpServer::Connection::LoopResult>,_kj::HttpServer::Connection::LoopResult>
            ::return_value((CoroutineMixin<kj::_::Coroutine<kj::HttpServer::Connection::LoopResult>,_kj::HttpServer::Connection::LoopResult>
                            *)this_00,LVar10);
            kj::_::PromiseAwaiter<kj::HttpServer::Connection::LoopResult>::~PromiseAwaiter
                      (__return_storage_ptr___04);
            Promise<kj::HttpServer::Connection::LoopResult>::~Promise
                      ((Promise<kj::HttpServer::Connection::LoopResult> *)this_06);
            local_1040 = 3;
          }
          if (local_1040 != 0xb) {
            local_ff0 = local_1040;
            goto LAB_0072cbd2;
          }
        }
        local_ff0 = 0;
      }
LAB_0072cbd2:
      if (local_ff0 == 0) {
LAB_0072cc19:
        kj::_::unreachable();
      }
      if (local_ff0 != 3) {
        if (local_ff0 == 4) goto LAB_0072cc19;
        goto LAB_0072cd5d;
      }
    }
    else {
      anon_unknown_36::HttpOutputStream::flush(this_02);
      pPVar12 = kj::_::Coroutine<kj::HttpServer::Connection::LoopResult>::
                await_transform<kj::Promise<void>>(this_00,(Promise<void> *)this_02);
      co_await<void>(__return_storage_ptr___00,pPVar12);
      bVar8 = kj::_::PromiseAwaiterBase::await_ready
                        ((PromiseAwaiterBase *)__return_storage_ptr___00);
      if (!bVar8) {
        *(undefined1 *)((long)puVar11 + 0xdac) = 2;
        onHeaders(in_stack_ffffffffffffef10,pvVar21);
        if ((extraout_AL_00 & 1) != 0) {
          return (PromiseBase)(PromiseBase)this;
        }
      }
      kj::_::PromiseAwaiter<void>::await_resume(__return_storage_ptr___00);
      kj::_::PromiseAwaiter<void>::~PromiseAwaiter(__return_storage_ptr___00);
      Promise<void>::~Promise((Promise<void> *)this_02);
      kj::_::
      CoroutineMixin<kj::_::Coroutine<kj::HttpServer::Connection::LoopResult>,_kj::HttpServer::Connection::LoopResult>
      ::return_value((CoroutineMixin<kj::_::Coroutine<kj::HttpServer::Connection::LoopResult>,_kj::HttpServer::Connection::LoopResult>
                      *)this_00,BREAK_LOOP_CONN_ERR);
    }
  }
  else {
    anon_unknown_36::HttpOutputStream::flush(this_01);
    pPVar12 = kj::_::Coroutine<kj::HttpServer::Connection::LoopResult>::
              await_transform<kj::Promise<void>>(this_00,(Promise<void> *)this_01);
    co_await<void>(__return_storage_ptr__,pPVar12);
    bVar8 = kj::_::PromiseAwaiterBase::await_ready((PromiseAwaiterBase *)__return_storage_ptr__);
    if (!bVar8) {
      *(undefined1 *)((long)puVar11 + 0xdac) = 1;
      onHeaders(in_stack_ffffffffffffef10,pvVar21);
      if ((extraout_AL & 1) != 0) {
        return (PromiseBase)(PromiseBase)this;
      }
    }
    kj::_::PromiseAwaiter<void>::await_resume(__return_storage_ptr__);
    kj::_::PromiseAwaiter<void>::~PromiseAwaiter(__return_storage_ptr__);
    Promise<void>::~Promise((Promise<void> *)this_01);
    if ((*(byte *)(*(long *)(puVar11[0x1b4] + 0x18) + 0x70) & 1) == 0) {
      local_f96 = false;
    }
    else {
      local_f96 = anon_unknown_36::HttpInputStreamImpl::isCleanDrain
                            ((HttpInputStreamImpl *)(puVar11[0x1b4] + 0x38));
    }
    kj::_::
    CoroutineMixin<kj::_::Coroutine<kj::HttpServer::Connection::LoopResult>,_kj::HttpServer::Connection::LoopResult>
    ::return_value((CoroutineMixin<kj::_::Coroutine<kj::HttpServer::Connection::LoopResult>,_kj::HttpServer::Connection::LoopResult>
                    *)this_00,BREAK_LOOP_CONN_ERR - local_f96);
  }
  kj::_::CoroutineBase::final_suspend((CoroutineBase *)this_00);
  bVar8 = std::__n4861::suspend_always::await_ready((suspend_always *)((long)puVar11 + 0xdaf));
  if (!bVar8) {
    *puVar11 = 0;
    *(undefined1 *)((long)puVar11 + 0xdac) = 7;
    onHeaders(in_stack_ffffffffffffef10,pvVar21);
    return (PromiseBase)(PromiseBase)this;
  }
  std::__n4861::suspend_always::await_resume((suspend_always *)((long)puVar11 + 0xdaf));
LAB_0072cd5d:
  kj::_::Coroutine<kj::HttpServer::Connection::LoopResult>::~Coroutine(this_00);
  if (puVar11 != (undefined8 *)0x0) {
    operator_delete(puVar11,0xdb0);
  }
  return (PromiseBase)(PromiseBase)this;
}

Assistant:

kj::Promise<LoopResult> onHeaders(HttpHeaders::RequestConnectOrProtocolError&& requestOrProtocolError) {
    if (timedOut) {
      // Client took too long to send anything, so we're going to close the connection. In
      // theory, we should send back an HTTP 408 error -- it is designed exactly for this
      // purpose. Alas, in practice, Google Chrome does not have any special handling for 408
      // errors -- it will assume the error is a response to the next request it tries to send,
      // and will happily serve the error to the user. OTOH, if we simply close the connection,
      // Chrome does the "right thing", apparently. (Though I'm not sure what happens if a
      // request is in-flight when we close... if it's a GET, the browser should retry. But if
      // it's a POST, retrying may be dangerous. This is why 408 exists -- it unambiguously
      // tells the client that it should retry.)
      //
      // Also note that if we ever decide to send 408 again, we might want to send some other
      // error in the case that the server is draining, which also sets timedOut = true; see
      // above.

      co_await httpOutput.flush();
      co_return (server.draining && httpInput.isCleanDrain()) ? BREAK_LOOP_CONN_OK : BREAK_LOOP_CONN_ERR;
    }

    if (closed) {
      // Client closed connection. Close our end too.
      co_await httpOutput.flush();
      co_return BREAK_LOOP_CONN_ERR;
    }

    KJ_SWITCH_ONEOF(requestOrProtocolError) {
      KJ_CASE_ONEOF(request, HttpHeaders::ConnectRequest) {
        co_return co_await onConnect(request);
      }
      KJ_CASE_ONEOF(request, HttpHeaders::Request) {
        co_return co_await onRequest(request);
      }
      KJ_CASE_ONEOF(protocolError, HttpHeaders::ProtocolError) {
        // Bad request.

        auto needClientGrace = protocolError.statusCode == 431;
        if (needClientGrace) {
          // We're going to reply with an error and close the connection.
          // The client might not be able to read the error back. Read some data and wait
          // a bit to give client a chance to finish writing.

          auto dummy = kj::heap<HttpDiscardingEntityWriter>();
          auto lengthGrace = kj::evalNow([&]() {
            return httpInput.discard(*dummy, server.settings.canceledUploadGraceBytes);
          }).catch_([](kj::Exception&& e) -> void { })
            .attach(kj::mv(dummy));
          auto timeGrace = server.timer.afterDelay(server.settings.canceledUploadGracePeriod);
          co_await lengthGrace.exclusiveJoin(kj::mv(timeGrace));
        }

        // sendError() uses Response::send(), which requires that we have a currentMethod, but we
        // never read one. GET seems like the correct choice here.
        currentMethod = HttpMethod::GET;
        co_return co_await sendError(kj::mv(protocolError));
      }
    }

    KJ_UNREACHABLE;
  }